

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void sarimax_wrapper_predict
               (sarimax_wrapper_object obj,double *inp,double *xreg,int L,double *newxreg,
               double *xpred,double *amse)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int d;
  int N;
  int D;
  int iVar6;
  int iVar7;
  sarimax_object psVar8;
  double *pdVar9;
  uint ip;
  int iVar10;
  uint uVar11;
  long lVar12;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  double dVar20;
  double *local_b0;
  double local_58;
  
  psVar8 = obj->sarimax;
  uVar1 = psVar8->p;
  uVar2 = psVar8->P;
  uVar3 = psVar8->Q;
  iVar4 = psVar8->s;
  lVar19 = (long)iVar4;
  ip = iVar4 * uVar2 + uVar1;
  uVar5 = psVar8->q;
  uVar13 = uVar3 * iVar4 + uVar5 + 1;
  if ((int)uVar13 < (int)ip) {
    uVar13 = ip;
  }
  d = psVar8->d;
  N = psVar8->N;
  lVar12 = (long)N;
  D = psVar8->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar10 = iVar4 * D;
  C_00 = (double *)malloc((long)iVar10 * 8 + 8);
  uVar11 = iVar10 + d + 1;
  oup = (double *)malloc((long)(int)uVar11 << 3);
  W = (double *)malloc(lVar12 * 8);
  resid = (double *)malloc(lVar12 * 8);
  iVar6 = obj->idrift;
  phi = (double *)malloc((long)(int)uVar13 << 3);
  theta = (double *)malloc((long)(int)uVar13 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    local_58 = psVar8->mean;
  }
  else {
    if (0 < d) {
      deld(d,C);
    }
    local_58 = 0.0;
    if (0 < D) {
      delds(D,iVar4,C_00);
    }
  }
  conv(C,d + 1,C_00,iVar10 + 1,oup);
  if (0 < iVar10 + d) {
    uVar14 = 1;
    do {
      oup[uVar14] = -oup[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  if (0 < N) {
    iVar7 = obj->idrift;
    psVar8 = obj->sarimax;
    uVar11 = psVar8->r;
    pdVar9 = psVar8->res;
    lVar15 = 0;
    local_b0 = xreg;
    do {
      dVar20 = inp[lVar15];
      if (D == 0 && d == 0) {
        dVar20 = dVar20 - local_58;
      }
      W[lVar15] = dVar20;
      if (iVar7 == 1) {
        dVar20 = dVar20 - (double)((int)lVar15 + 1) * *psVar8->exog;
        W[lVar15] = dVar20;
      }
      if ((int)(uint)(iVar6 == 1) < (int)uVar11 && 0 < (int)uVar11) {
        pdVar18 = psVar8->exog;
        uVar14 = (ulong)(iVar6 == 1);
        pdVar17 = local_b0;
        do {
          dVar20 = dVar20 - pdVar18[uVar14] * *pdVar17;
          W[lVar15] = dVar20;
          uVar14 = uVar14 + 1;
          pdVar17 = pdVar17 + lVar12;
        } while (uVar11 != uVar14);
      }
      resid[lVar15] = pdVar9[lVar15];
      lVar15 = lVar15 + 1;
      local_b0 = local_b0 + 1;
    } while (lVar15 != lVar12);
  }
  if (0 < (int)uVar13) {
    memset(theta,0,(ulong)uVar13 << 3);
    memset(phi,0,(ulong)uVar13 << 3);
  }
  if (0 < (int)uVar1) {
    pdVar9 = obj->sarimax->phi;
    uVar14 = 0;
    do {
      phi[uVar14] = pdVar9[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar1 != uVar14);
  }
  if (0 < (int)uVar5) {
    pdVar9 = obj->sarimax->theta;
    uVar14 = 0;
    do {
      theta[uVar14] = -pdVar9[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar5 != uVar14);
  }
  if (0 < (int)uVar2) {
    psVar8 = obj->sarimax;
    pdVar9 = psVar8->PHI;
    uVar14 = 0;
    pdVar18 = phi;
    do {
      pdVar18 = pdVar18 + lVar19;
      dVar20 = pdVar9[uVar14];
      uVar14 = uVar14 + 1;
      phi[uVar14 * lVar19 + -1] = phi[uVar14 * lVar19 + -1] + dVar20;
      if (0 < (int)uVar1) {
        pdVar17 = psVar8->phi;
        uVar16 = 0;
        do {
          pdVar18[uVar16] = pdVar18[uVar16] - pdVar17[uVar16] * dVar20;
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
      }
    } while (uVar14 != uVar2);
  }
  if (0 < (int)uVar3) {
    psVar8 = obj->sarimax;
    pdVar9 = psVar8->THETA;
    uVar14 = 0;
    pdVar18 = theta;
    do {
      pdVar18 = pdVar18 + lVar19;
      dVar20 = pdVar9[uVar14];
      uVar14 = uVar14 + 1;
      theta[uVar14 * lVar19 + -1] = theta[uVar14 * lVar19 + -1] - dVar20;
      if (0 < (int)uVar5) {
        pdVar17 = psVar8->theta;
        uVar16 = 0;
        do {
          pdVar18[uVar16] = pdVar17[uVar16] * dVar20 + pdVar18[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar5 != uVar16);
      }
    } while (uVar14 != uVar3);
  }
  forkal(ip,uVar3 * iVar4 + uVar5,iVar10 + d,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    iVar4 = obj->idrift;
    psVar8 = obj->sarimax;
    uVar1 = psVar8->r;
    uVar14 = 0;
    do {
      dVar20 = xpred[uVar14] + local_58;
      xpred[uVar14] = dVar20;
      if (iVar4 == 1) {
        dVar20 = dVar20 + (double)(N + 1 + (int)uVar14) * *psVar8->exog;
        xpred[uVar14] = dVar20;
      }
      if ((int)(uint)(iVar6 == 1) < (int)uVar1) {
        pdVar9 = psVar8->exog;
        pdVar18 = newxreg;
        uVar16 = (ulong)(iVar6 == 1);
        do {
          dVar20 = dVar20 + pdVar9[uVar16] * *pdVar18;
          xpred[uVar14] = dVar20;
          uVar16 = uVar16 + 1;
          pdVar18 = pdVar18 + (uint)L;
        } while (uVar1 != uVar16);
      }
      uVar14 = uVar14 + 1;
      newxreg = newxreg + 1;
    } while (uVar14 != (uint)L);
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void sarimax_wrapper_predict(sarimax_wrapper_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j,diter;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->sarimax->d;
	N = obj->sarimax->N;
	p = obj->sarimax->p;
	q = obj->sarimax->q;
	D = obj->sarimax->D;
	P = obj->sarimax->P;
	Q = obj->sarimax->Q;
	s = obj->sarimax->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	diter = 0;

	if (obj->idrift == 1) {
		diter = 1;		
	}


	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->sarimax->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->idrift == 1) {
			W[i] -= obj->sarimax->exog[0]*(i+1);
		}
		if (obj->sarimax->r > 0) {
			for(j = diter; j < obj->sarimax->r;++j) {
				W[i] -= obj->sarimax->exog[j] * xreg[(j-diter)*N+i];
			}
		}
		resid[i] = obj->sarimax->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->sarimax->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->sarimax->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->sarimax->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->sarimax->phi[i] * obj->sarimax->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->sarimax->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->sarimax->theta[i] * obj->sarimax->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		if (obj->idrift == 1) {
			xpred[i] += obj->sarimax->exog[0]*(i+1+N);
		}
		for(j = diter; j < obj->sarimax->r;++j) {
			xpred[i] += obj->sarimax->exog[j] * newxreg[(j - diter)*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}